

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O1

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::rehash_impl(robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              *this,size_type count_)

{
  bucket_entry *pbVar1;
  short sVar2;
  pointer pbVar3;
  undefined8 uVar4;
  bucket_entry<std::pair<unsigned_long,_double>,_false> *bucket;
  pointer pbVar5;
  ulong uVar6;
  short __tmp;
  short sVar7;
  robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  new_table;
  allocator<std::pair<unsigned_long,_double>_> local_61;
  robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  local_60;
  
  robin_hash(&local_60,count_,(hash<unsigned_long> *)this,(equal_to<unsigned_long> *)this,&local_61,
             this->m_min_load_factor,this->m_max_load_factor);
  pbVar5 = (this->m_buckets_data).
           super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->m_buckets_data).
           super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_001591bd:
  if (pbVar5 == pbVar3) {
    local_60.m_nb_elements = this->m_nb_elements;
    swap(&local_60,this);
    std::
    vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
    ::~vector(&local_60.m_buckets_data);
    return;
  }
  if (pbVar5->m_dist_from_ideal_bucket != -1) {
    uVar6 = *(ulong *)pbVar5->m_value;
    sVar7 = 0;
    do {
      uVar6 = local_60.super_power_of_two_growth_policy<2UL>.m_mask & uVar6;
      sVar2 = local_60.m_buckets[uVar6].m_dist_from_ideal_bucket;
      if (sVar2 < sVar7) {
        pbVar1 = local_60.m_buckets + uVar6;
        if (sVar2 == -1) goto LAB_0015923a;
        uVar4 = *(undefined8 *)pbVar5->m_value;
        *(undefined8 *)pbVar5->m_value = *(undefined8 *)pbVar1->m_value;
        *(undefined8 *)pbVar1->m_value = uVar4;
        uVar4 = *(undefined8 *)(pbVar5->m_value + 8);
        *(undefined8 *)(pbVar5->m_value + 8) = *(undefined8 *)(pbVar1->m_value + 8);
        *(undefined8 *)(pbVar1->m_value + 8) = uVar4;
        pbVar1->m_dist_from_ideal_bucket = sVar7;
        sVar7 = sVar2;
      }
      sVar7 = sVar7 + 1;
      uVar6 = uVar6 + 1;
    } while( true );
  }
  goto LAB_00159248;
LAB_0015923a:
  uVar4 = *(undefined8 *)(pbVar5->m_value + 8);
  *(undefined8 *)pbVar1->m_value = *(undefined8 *)pbVar5->m_value;
  *(undefined8 *)(pbVar1->m_value + 8) = uVar4;
  pbVar1->m_dist_from_ideal_bucket = sVar7;
LAB_00159248:
  pbVar5 = pbVar5 + 1;
  goto LAB_001591bd;
}

Assistant:

void rehash_impl(size_type count_) {
    robin_hash new_table(count_, static_cast<Hash&>(*this),
                         static_cast<KeyEqual&>(*this), get_allocator(),
                         m_min_load_factor, m_max_load_factor);
    tsl_rh_assert(size() <= new_table.m_load_threshold);

    const bool use_stored_hash =
        USE_STORED_HASH_ON_REHASH(new_table.bucket_count());
    for (auto& bucket : m_buckets_data) {
      if (bucket.empty()) {
        continue;
      }

      const std::size_t hash =
          use_stored_hash ? bucket.truncated_hash()
                          : new_table.hash_key(KeySelect()(bucket.value()));

      new_table.insert_value_on_rehash(new_table.bucket_for_hash(hash), 0,
                                       bucket_entry::truncate_hash(hash),
                                       std::move(bucket.value()));
    }

    new_table.m_nb_elements = m_nb_elements;
    new_table.swap(*this);
  }